

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

uint32 __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::DeleteDownTo
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,ES5Array *arr,uint32 first,
          PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  undefined8 in_RAX;
  undefined4 *puVar5;
  uint uVar6;
  uint32 uVar7;
  uint local_34 [2];
  uint32 lastIndex;
  
  local_34[0] = (uint)((ulong)in_RAX >> 0x20);
  uVar6 = (arr->super_JavascriptArray).super_ArrayObject.length;
  if (uVar6 <= first) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                ,0x3a6,"(first < arr->GetLength())","first < arr->GetLength()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    uVar6 = (arr->super_JavascriptArray).super_ArrayObject.length;
  }
  if (uVar6 - first < 5) {
    do {
      uVar7 = uVar6;
      if (uVar7 <= first) {
        return uVar7;
      }
      iVar3 = (*(arr->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2a])
                        (arr,(ulong)(uVar7 - 1),(ulong)propertyOperationFlags);
      uVar6 = uVar7 - 1;
    } while (iVar3 != 0);
  }
  else {
    if ((this->dataItemAttributes & 2) != 0) {
      uVar4 = IndexPropertyDescriptorMap::DeleteDownTo((this->indexPropertyMap).ptr,first);
      return uVar4;
    }
    bVar2 = IndexPropertyDescriptorMap::TryGetLastIndex((this->indexPropertyMap).ptr,local_34);
    uVar4 = local_34[0] + 1;
    if (local_34[0] < first) {
      uVar4 = first;
    }
    if (!bVar2) {
      uVar4 = first;
    }
    bVar2 = TryGetLastDataItemIndex(this,arr,uVar4,local_34);
    uVar7 = local_34[0] + 1;
    if (!bVar2) {
      uVar7 = uVar4;
    }
  }
  return uVar7;
}

Assistant:

uint32 ES5ArrayTypeHandlerBase<T>::DeleteDownTo(ES5Array* arr, uint32 first, PropertyOperationFlags propertyOperationFlags)
    {
        Assert(first < arr->GetLength()); // Only called when newLen < oldLen

        // If the number of elements to be deleted is small, iterate on it.
        uint32 count = arr->GetLength() - first;
        if (count < 5)
        {
            uint32 oldLen = arr->GetLength();
            while (first < oldLen)
            {
                if (!arr->DeleteItem(oldLen - 1, propertyOperationFlags))
                {
                    break;
                }
                --oldLen;
            }

            return oldLen;
        }

        // If data items are [[CanDelete]], check attribute map only.
        if (GetDataItemAttributes() & PropertyConfigurable)
        {
            return indexPropertyMap->DeleteDownTo(first);
        }
        else
        {
            // The array isSealed. No existing item can be deleted. Look for the max index.
            uint32 lastIndex;
            if (indexPropertyMap->TryGetLastIndex(&lastIndex) && lastIndex >= first)
            {
                first = lastIndex + 1;
            }
            if (TryGetLastDataItemIndex(arr, first, &lastIndex))
            {
                first = lastIndex + 1;
            }
            return first;
        }
    }